

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipMessage
               (CodedInputStream *input,CodedOutputStream *output)

{
  byte bVar1;
  bool bVar2;
  uint32 uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  byte unaff_R15B;
  ulong uVar8;
  
  do {
    pbVar4 = input->buffer_;
    if (pbVar4 < input->buffer_end_) {
      bVar1 = *pbVar4;
      uVar8 = (ulong)bVar1;
      uVar3 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00256fd2;
      input->buffer_ = pbVar4 + 1;
    }
    else {
      uVar3 = 0;
LAB_00256fd2:
      uVar3 = io::CodedInputStream::ReadTagFallback(input,uVar3);
      uVar8 = (ulong)uVar3;
    }
    uVar6 = (uint)uVar8;
    input->last_tag_ = uVar6;
    if (uVar6 == 0) {
LAB_00257067:
      bVar2 = false;
      unaff_R15B = true;
    }
    else {
      if ((uVar6 & 7) == 4) {
        pbVar4 = output->cur_;
        if ((output->impl_).end_ <= pbVar4) {
          pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
        }
        output->cur_ = pbVar4;
        if (uVar6 < 0x80) {
          *pbVar4 = (byte)uVar8;
          pbVar4 = pbVar4 + 1;
        }
        else {
          *pbVar4 = (byte)uVar8 | 0x80;
          uVar8 = uVar8 >> 7;
          if (uVar6 < 0x4000) {
            pbVar4[1] = (byte)uVar8;
            pbVar4 = pbVar4 + 2;
          }
          else {
            pbVar4 = pbVar4 + 2;
            do {
              pbVar5 = pbVar4;
              uVar6 = (uint)uVar8;
              pbVar5[-1] = (byte)uVar8 | 0x80;
              uVar7 = uVar6 >> 7;
              uVar8 = (ulong)uVar7;
              pbVar4 = pbVar5 + 1;
            } while (0x3fff < uVar6);
            *pbVar5 = (byte)uVar7;
          }
        }
        output->cur_ = pbVar4;
        goto LAB_00257067;
      }
      bVar2 = SkipField(input,uVar6,output);
      unaff_R15B = unaff_R15B & bVar2;
    }
    if (bVar2 == false) {
      return (bool)unaff_R15B;
    }
  } while( true );
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input,
                                 io::CodedOutputStream* output) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      output->WriteVarint32(tag);
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, output)) return false;
  }
}